

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CheckBlock
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double x;
  double y;
  double __x;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *thing;
  AActor *pAVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  AActor *origin;
  VMValue *pVVar8;
  bool bVar9;
  double __x_00;
  double dVar10;
  DVector2 v;
  double local_70;
  double local_68;
  double local_60;
  DVector2 local_40;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003e3941;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e3931:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e3941:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1992,
                  "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003e3548;
    pPVar3 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (origin->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar9 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar9) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar9 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e3941;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003e3931;
LAB_003e3548:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[1].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e3a0d:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1993,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar5 = pVVar8[1].field_0.i;
LAB_003e359e:
    if (pVVar8[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e3a2c:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1994,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = pVVar8[2].field_0.i;
LAB_003e35ad:
    if (pVVar8[3].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e39bd:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1995,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_60 = pVVar8[3].field_0.f;
LAB_003e35be:
    if (pVVar8[4].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e399e:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1996,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_68 = pVVar8[4].field_0.f;
LAB_003e35cf:
    if (pVVar8[5].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e397f:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1997,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_70 = pVVar8[5].field_0.f;
LAB_003e35e0:
    if (pVVar8[6].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e3960:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1998,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e3a0d;
    }
    uVar5 = param[1].field_0.i;
    if (numparam < 3) {
      pVVar8 = defaultparam->Array;
      goto LAB_003e359e;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e3a2c;
    }
    iVar2 = param[2].field_0.i;
    if (numparam == 3) {
      pVVar8 = defaultparam->Array;
      goto LAB_003e35ad;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e39bd;
    }
    local_60 = param[3].field_0.f;
    if ((uint)numparam < 5) {
      pVVar8 = defaultparam->Array;
      goto LAB_003e35be;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e399e;
    }
    local_68 = param[4].field_0.f;
    if (numparam == 5) {
      pVVar8 = defaultparam->Array;
      goto LAB_003e35cf;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e397f;
    }
    local_70 = param[5].field_0.f;
    if ((uint)numparam < 7) {
      pVVar8 = defaultparam->Array;
      goto LAB_003e35e0;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e3960;
    }
  }
  thing = COPY_AAPTR(origin,iVar2);
  if (thing == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x199f,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
LAB_003e3882:
    if (ret->RegType != '\0') goto LAB_003e39de;
    uVar7 = 0;
  }
  else {
    x = (thing->__Pos).X;
    y = (thing->__Pos).Y;
    __x = (thing->__Pos).Z;
    if (-1 < (char)uVar5) {
      __x_00 = FFastTrig::sin(&fasttrig,__x);
      dVar10 = FFastTrig::cos(&fasttrig,__x_00);
      P_GetOffsetPosition((thing->__Pos).X,(thing->__Pos).Y,local_68 * __x_00 + local_60 * dVar10,
                          local_60 * __x_00 - local_68 * dVar10);
      local_70 = local_70 + (thing->__Pos).Z;
      local_60 = local_40.X;
      local_68 = local_40.Y;
    }
    if ((uVar5 & 0x20) == 0) {
      AActor::SetOrigin(thing,local_60,local_68,local_70,true);
      bVar9 = P_TestMobjLocation(thing);
      AActor::SetOrigin(thing,x,y,__x,true);
      if (bVar9) {
LAB_003e3872:
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x19d1,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003e3882;
      }
    }
    else {
      (thing->__Pos).Z = local_70;
      local_40.X = local_60;
      local_40.Y = local_68;
      bVar9 = P_CheckMove(thing,&local_40,((uVar5 & 0x40) >> 5) + (uVar5 & 1) * 4 + 1);
      (thing->__Pos).Z = __x;
      if (bVar9) goto LAB_003e3872;
    }
    if (thing->BlockingMobj != (AActor *)0x0) {
      pAVar4 = thing;
      if ((uVar5 & 0x10) == 0) {
        pAVar4 = origin;
      }
      if (pAVar4 != (AActor *)0x0) {
        if ((uVar5 & 2) != 0) {
          (pAVar4->target).field_0.p = thing->BlockingMobj;
        }
        if ((uVar5 & 4) != 0) {
          (pAVar4->master).field_0 =
               (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)thing->BlockingMobj;
        }
        if ((uVar5 & 8) != 0) {
          (pAVar4->tracer).field_0 =
               (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)thing->BlockingMobj;
        }
      }
    }
    if ((((uVar5 & 0x40) != 0) || (uVar7 = 1, thing->BlockingMobj == (AActor *)0x0)) &&
       (((uVar5 & 1) != 0 || (uVar7 = 1, thing->BlockingLine == (line_t *)0x0)))) {
      uVar7 = (uVar5 & 0x20) >> 5;
    }
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x19e4,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (ret->RegType != '\0') {
LAB_003e39de:
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
  }
  *(uint *)ret->Location = uVar7;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckBlock)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags)	
	PARAM_INT_DEF(ptr)		
	PARAM_FLOAT_DEF(xofs)	
	PARAM_FLOAT_DEF(yofs)	
	PARAM_FLOAT_DEF(zofs)	
	PARAM_ANGLE_DEF(angle)	

	AActor *mobj = COPY_AAPTR(self, ptr);

	//Needs at least one state jump to work. 
	if (!mobj)
	{
		ACTION_RETURN_BOOL(false);
	}

	if (!(flags & CBF_ABSOLUTEANGLE))
	{
		angle += self->Angles.Yaw;
	}

	DVector3 oldpos = mobj->Pos();
	DVector3 pos;

	if (flags & CBF_ABSOLUTEPOS)
	{
		pos = { xofs, yofs, zofs };
	}
	else
	{
		double s = angle.Sin();
		double c = angle.Cos();
		pos = mobj->Vec3Offset(xofs * c + yofs * s, xofs * s - yofs * c, zofs);
	}
	
	// Next, try checking the position based on the sensitivity desired.
	// If checking for dropoffs, set the z so we can have maximum flexibility.
	// Otherwise, set origin and set it back after testing.

	bool checker = false;
	if (flags & CBF_DROPOFF)
	{
		// Unfortunately, whenever P_CheckMove returned false, that means it could
		// ignore a variety of flags mainly because of P_CheckPosition. This
		// results in picking up false positives due to actors or lines being in the way
		// when they clearly should not be.

		int fpass = PCM_DROPOFF;
		if (flags & CBF_NOACTORS)	fpass |= PCM_NOACTORS;
		if (flags & CBF_NOLINES)	fpass |= PCM_NOLINES;
		mobj->SetZ(pos.Z);
		checker = P_CheckMove(mobj, pos, fpass);
		mobj->SetZ(oldpos.Z);
	}
	else
	{
		mobj->SetOrigin(pos, true);
		checker = P_TestMobjLocation(mobj);
		mobj->SetOrigin(oldpos, true);
	}
	
	if (checker)
	{
		ACTION_RETURN_BOOL(false);
	}

	if (mobj->BlockingMobj)
	{
		AActor *setter = (flags & CBF_SETONPTR) ? mobj : self;
		if (setter)
		{
			if (flags & CBF_SETTARGET)	setter->target = mobj->BlockingMobj;
			if (flags & CBF_SETMASTER)	setter->master = mobj->BlockingMobj;
			if (flags & CBF_SETTRACER)	setter->tracer = mobj->BlockingMobj;
		}
	}

	//[MC] I don't know why I let myself be persuaded not to include a flag.
	//If an actor is loaded with pointers, they don't really have any options to spare.
	//Also, fail if a dropoff or a step is too great to pass over when checking for dropoffs.
	
	ACTION_RETURN_BOOL((!(flags & CBF_NOACTORS) && (mobj->BlockingMobj)) || (!(flags & CBF_NOLINES) && mobj->BlockingLine != NULL) ||
		((flags & CBF_DROPOFF) && !checker));
}